

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O0

void __thiscall RandomizerWorld::load_hint_sources(RandomizerWorld *this)

{
  bool bVar1;
  HintSource *local_a8;
  HintSource *new_source;
  Json *hint_source_json;
  iterator __end1;
  iterator __begin1;
  Json *__range1;
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  local_40;
  undefined1 local_20 [8];
  Json hint_sources_json;
  RandomizerWorld *this_local;
  
  hint_sources_json.m_value = (json_value)this;
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::function(&local_40,(nullptr_t)0x0);
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[52249]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)local_20,
             (uchar (*) [52249])
             "[\n    {\n        \"description\": \"Lithograph\",\n        \"smallTextbox\": true\n    },\n    {\n        \"description\": \"Oracle Stone\",\n        \"smallTextbox\": true\n    },\n    {\n        \"description\": \"Mercator fortune teller\",\n        \"textIds\": [\n            654\n        ]\n    },\n    {\n        \"description\": \"King Nole\'s Cave sign\",\n        \"textIds\": [\n            253\n        ]\n    },\n    {\n        \"description\": \"Foxy (next to Ryuma\'s mayor house)\",\n        \"entity\": {\n            \"mapId\": 611,\n            \"position\": {\n                \"x\": 47,\n                \"y\": 25,\n                \"z\": 3\n            },\n            \"orientation\": \"sw\"\n        },\n        \"nodeId\": \"ryuma\"\n    },\n    {\n        \"description\": \"Foxy (behind trees in Gumi)\",\n        \"entity\": {\n            \"mapId\": [ 602, 603 ],\n            \"position\": {\n                \"x\": 24,\n                \"y\": 35,\n                \"z\": 6\n            },\n            \"orientation\": \"sw\"\n        },\n        \"nodeId\": \"gumi\"\n    },\n    {\n        \"description\": \"Foxy (next to Mercator gates)\",\n        \"entity\": {\n            \"mapId\": 454,\n            \"position\": {\n                \"x\": 18,\n                \"y\": 46,\n                \"z\": 0\n            },\n            \"orientation\": \"se\"\n        },\n        \"nodeId\": \"route_gumi_ryuma\"\n    },\n    {\n        \"description\": \"Foxy (near basin behind Mercator)\",\n        \"entity\": {\n            \"mapId\": 636,\n            \"position\": {\n                \"x\": 18,\n                \"y\": 27,\n                \"z\": 1\n            },\n            \"orientation\": \"nw\"\n        },\n        \"nodeId\": \"mercator\"\n    },\n    {\n        \"description\": \"Foxy (near cabin on Verla Shore)\",\n        \"entity\": {\n            \"mapId\": 468,\n            \"position\": {\n                \"x\": 24,\n                \"y\": 45,\n                \"z\": 1\n            },\n            \"orientation\": \"se\"\n        },\n        \"nodeId\": \"verla_shore\"\n    },\n    {\n        \"description\": \"Foxy (outside Verla Mines entrance)\",\n        \"entity\": {\n            \"mapId\": 470,\n            \"position\": {\n..." /* TRUNCATED STRING LITERAL */
             ,&local_40,true,true);
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_40);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin((iterator *)&__end1.m_it.primitive_iterator,
          (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *)local_20);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end((iterator *)&hint_source_json,
        (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         *)local_20);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__end1.m_it.primitive_iterator,
                       (iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&hint_source_json);
    if (!bVar1) break;
    new_source = (HintSource *)
                 nlohmann::detail::
                 iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)&__end1.m_it.primitive_iterator);
    local_a8 = HintSource::from_json((Json *)new_source,&this->_nodes);
    std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
              ((vector<HintSource*,std::allocator<HintSource*>> *)&this->_hint_sources,&local_a8);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&__end1.m_it.primitive_iterator);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_20);
  return;
}

Assistant:

void RandomizerWorld::load_hint_sources()
{
    Json hint_sources_json = Json::parse(HINT_SOURCES_JSON, nullptr, true, true);
    for(const Json& hint_source_json : hint_sources_json)
    {
        HintSource* new_source = HintSource::from_json(hint_source_json, _nodes);
        _hint_sources.emplace_back(new_source);
    }
}